

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineBasic.cpp
# Opt level: O2

void anon_unknown.dwarf_e1e9c::readFile
               (string *filename,int channelCount,bool bulkRead,bool randomChannels)

{
  float fVar1;
  LineOrder LVar2;
  Compression CVar3;
  PixelType PVar4;
  PixelType t;
  bool bVar5;
  __type _Var6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Header *this;
  Box2i *pBVar11;
  Box2i *pBVar12;
  float *pfVar13;
  V2f *pVVar14;
  V2f *pVVar15;
  LineOrder *pLVar16;
  Compression *pCVar17;
  ChannelList *this_00;
  ChannelList *other;
  string *__lhs;
  string *__rhs;
  ulong uVar18;
  ostream *poVar19;
  void *pvVar20;
  void **ppvVar21;
  undefined7 in_register_00000009;
  long lVar22;
  ulong uVar23;
  long lVar24;
  int k_1;
  long lVar25;
  long lVar26;
  char *pcVar27;
  long lVar28;
  size_t spst;
  long lVar29;
  undefined1 xtc;
  undefined8 in_R10;
  int k;
  int iVar30;
  ulong uVar31;
  ulong uVar32;
  int j_1;
  uint uVar33;
  long lVar34;
  int j;
  long lVar35;
  long lVar36;
  float fVar37;
  Array<Imf_2_5::Array2D<void_*>_> data;
  Array2D<unsigned_int> localSampleCount;
  DeepScanLineInputFile file;
  vector<int,_std::allocator<int>_> read_channel;
  string str;
  DeepFrameBuffer frameBuffer;
  DeepSlice local_1f0;
  stringstream ss;
  undefined1 local_1a8 [376];
  
  pcVar27 = " reading all channels ";
  if ((int)CONCAT71(in_register_00000009,randomChannels) != 0) {
    pcVar27 = " reading random channels ";
  }
  std::operator<<((ostream *)&std::cout,pcVar27);
  std::ostream::flush();
  Imf_2_5::DeepScanLineInputFile::DeepScanLineInputFile(&file,(filename->_M_dataplus)._M_p,8);
  this = Imf_2_5::DeepScanLineInputFile::header(&file);
  pBVar11 = Imf_2_5::Header::displayWindow(this);
  pBVar12 = Imf_2_5::Header::displayWindow((Header *)(anonymous_namespace)::header);
  bVar5 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(pBVar11,pBVar12);
  if (!bVar5) {
    __assert_fail("fileHeader.displayWindow() == header.displayWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x10a,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pBVar11 = Imf_2_5::Header::dataWindow(this);
  pBVar12 = Imf_2_5::Header::dataWindow((Header *)(anonymous_namespace)::header);
  bVar5 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(pBVar11,pBVar12);
  if (!bVar5) {
    __assert_fail("fileHeader.dataWindow() == header.dataWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x10b,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pfVar13 = Imf_2_5::Header::pixelAspectRatio(this);
  fVar37 = *pfVar13;
  pfVar13 = Imf_2_5::Header::pixelAspectRatio((Header *)(anonymous_namespace)::header);
  if ((fVar37 != *pfVar13) || (NAN(fVar37) || NAN(*pfVar13))) {
    __assert_fail("fileHeader.pixelAspectRatio() == header.pixelAspectRatio()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x10c,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pVVar14 = Imf_2_5::Header::screenWindowCenter(this);
  pVVar15 = Imf_2_5::Header::screenWindowCenter((Header *)(anonymous_namespace)::header);
  if ((((pVVar14->x != pVVar15->x) || (NAN(pVVar14->x) || NAN(pVVar15->x))) ||
      (pVVar14->y != pVVar15->y)) || (NAN(pVVar14->y) || NAN(pVVar15->y))) {
    __assert_fail("fileHeader.screenWindowCenter() == header.screenWindowCenter()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x10d,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pfVar13 = Imf_2_5::Header::screenWindowWidth(this);
  fVar37 = *pfVar13;
  pfVar13 = Imf_2_5::Header::screenWindowWidth((Header *)(anonymous_namespace)::header);
  if ((fVar37 != *pfVar13) || (NAN(fVar37) || NAN(*pfVar13))) {
    __assert_fail("fileHeader.screenWindowWidth() == header.screenWindowWidth()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x10e,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pLVar16 = Imf_2_5::Header::lineOrder(this);
  LVar2 = *pLVar16;
  pLVar16 = Imf_2_5::Header::lineOrder((Header *)(anonymous_namespace)::header);
  if (LVar2 != *pLVar16) {
    __assert_fail("fileHeader.lineOrder() == header.lineOrder()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x10f,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  pCVar17 = Imf_2_5::Header::compression(this);
  CVar3 = *pCVar17;
  pCVar17 = Imf_2_5::Header::compression((Header *)(anonymous_namespace)::header);
  if (CVar3 != *pCVar17) {
    __assert_fail("fileHeader.compression() == header.compression()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x110,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  this_00 = Imf_2_5::Header::channels(this);
  other = Imf_2_5::Header::channels((Header *)(anonymous_namespace)::header);
  bVar5 = Imf_2_5::ChannelList::operator==(this_00,other);
  if (!bVar5) {
    __assert_fail("fileHeader.channels() == header.channels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x111,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  __lhs = Imf_2_5::Header::type_abi_cxx11_(this);
  __rhs = Imf_2_5::Header::type_abi_cxx11_((Header *)(anonymous_namespace)::header);
  _Var6 = std::operator==(__lhs,__rhs);
  if (!_Var6) {
    __assert_fail("fileHeader.type() == header.type()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                  ,0x112,
                  "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)");
  }
  localSampleCount._sizeX = 0;
  localSampleCount._sizeY = 0;
  localSampleCount._data = (uint *)0x0;
  Imf_2_5::Array2D<unsigned_int>::resizeErase(&localSampleCount,0xad,0x111);
  uVar7 = random_int(3);
  uVar33 = uVar7 + channelCount;
  Imf_2_5::Array<Imf_2_5::Array2D<void_*>_>::Array(&data,(long)(int)uVar33);
  uVar23 = 0;
  uVar18 = (ulong)uVar33;
  if ((int)uVar33 < 1) {
    uVar18 = uVar23;
  }
  for (; xtc = (undefined1)in_R10, uVar18 * 0x18 - uVar23 != 0; uVar23 = uVar23 + 0x18) {
    Imf_2_5::Array2D<void_*>::resizeErase
              ((Array2D<void_*> *)((long)&(data._data)->_sizeX + uVar23),0xad,0x111);
  }
  Imf_2_5::DeepFrameBuffer::DeepFrameBuffer(&frameBuffer);
  Imf_2_5::Slice::Slice
            ((Slice *)&ss,UINT,
             (char *)(localSampleCount._data +
                     ((long)DAT_004233d4 * -0x111 - (long)(anonymous_namespace)::dataWindow)),4,
             0x444,1,1,0.0,(bool)xtc,(bool)((char)DAT_004233d4 * 'D'));
  Imf_2_5::DeepFrameBuffer::insertSampleCountSlice(&frameBuffer,(Slice *)&ss);
  std::vector<int,_std::allocator<int>_>::vector
            (&read_channel,(ulong)(uint)channelCount,(allocator_type *)&ss);
  uVar23 = 0;
  uVar18 = 0;
  if (0 < channelCount) {
    uVar18 = (ulong)(uint)channelCount;
  }
  lVar35 = 0x10;
  iVar30 = 0;
  do {
    if (uVar18 == uVar23) {
      if (iVar30 == 0) {
        std::operator<<((ostream *)&std::cout,"skipping ");
        std::ostream::flush();
      }
      else {
        lVar35 = (long)channelCount;
        uVar31 = 0;
        uVar23 = (ulong)uVar7;
        if ((int)uVar7 < 1) {
          uVar23 = uVar31;
        }
        lVar25 = lVar35 * 0x18;
        for (; uVar23 != uVar31; uVar31 = uVar31 + 1) {
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          poVar19 = (ostream *)std::ostream::operator<<(local_1a8,(int)uVar31);
          std::operator<<(poVar19,"fill");
          std::__cxx11::stringbuf::str();
          Imf_2_5::DeepSlice::DeepSlice
                    (&local_1f0,FLOAT,
                     (char *)(*(long *)((long)&(data._data)->_data + lVar25) +
                              (long)(anonymous_namespace)::dataWindow * -8 +
                             (long)DAT_004233d4 * -0x888),8,0x888,4,1,1,0.0,false,false);
          Imf_2_5::DeepFrameBuffer::insert(&frameBuffer,&str,&local_1f0);
          std::__cxx11::string::~string((string *)&str);
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          lVar25 = lVar25 + 0x18;
        }
        Imf_2_5::DeepScanLineInputFile::setFrameBuffer(&file,&frameBuffer);
        if (bulkRead) {
          std::operator<<((ostream *)&std::cout,"bulk ");
          std::ostream::flush();
          Imf_2_5::DeepScanLineInputFile::readPixelSampleCounts(&file,DAT_004233d4,DAT_004233dc);
          iVar8 = DAT_004233dc;
          iVar30 = DAT_004233d4;
          iVar9 = DAT_004233dc - DAT_004233d4;
          lVar22 = (anonymous_namespace)::sampleCount._8_8_ * 4;
          lVar25 = localSampleCount._sizeY * 4;
          lVar28 = 0;
          lVar29 = 0;
          for (lVar34 = 0; lVar34 <= iVar9; lVar34 = lVar34 + 1) {
            lVar36 = 0;
            while (lVar36 != 0x111) {
              lVar26 = lVar36 * 4;
              lVar24 = lVar36 * 4;
              lVar36 = lVar36 + 1;
              if (*(int *)((long)localSampleCount._data + lVar26 + lVar28) !=
                  *(int *)((anonymous_namespace)::sampleCount._16_8_ + lVar29 + lVar24)) {
                __assert_fail("localSampleCount[i][j] == sampleCount[i][j]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                              ,0x176,
                              "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                             );
              }
            }
            for (lVar36 = 0; lVar36 != 0x111; lVar36 = lVar36 + 1) {
              lVar24 = localSampleCount._sizeY * lVar34;
              lVar26 = 4;
              for (uVar31 = 0; uVar18 != uVar31; uVar31 = uVar31 + 1) {
                if ((!randomChannels) ||
                   (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar31] == 1)) {
                  iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar31 * 4);
                  if (iVar10 == 0) {
                    pvVar20 = operator_new__((ulong)localSampleCount._data[lVar24 + lVar36] << 2);
                    *(void **)(*(long *)((long)data._data + lVar26 * 4 + -8) * lVar34 * 8 +
                               *(long *)((long)&(data._data)->_sizeX + lVar26 * 4) + lVar36 * 8) =
                         pvVar20;
                    iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar31 * 4);
                  }
                  if (iVar10 == 1) {
                    pvVar20 = operator_new__((ulong)localSampleCount._data[lVar24 + lVar36] * 2);
                    *(void **)(*(long *)((long)data._data + lVar26 * 4 + -8) * lVar34 * 8 +
                               *(long *)((long)&(data._data)->_sizeX + lVar26 * 4) + lVar36 * 8) =
                         pvVar20;
                    iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar31 * 4);
                  }
                  if (iVar10 == 2) {
                    pvVar20 = operator_new__((ulong)localSampleCount._data[lVar24 + lVar36] << 2);
                    *(void **)(*(long *)((long)data._data + lVar26 * 4 + -8) * lVar34 * 8 +
                               *(long *)((long)&(data._data)->_sizeX + lVar26 * 4) + lVar36 * 8) =
                         pvVar20;
                  }
                }
                lVar26 = lVar26 + 6;
              }
              lVar24 = localSampleCount._sizeY * lVar34;
              lVar26 = lVar35 * 0x18 + 0x10;
              uVar31 = uVar23;
              while (bVar5 = uVar31 != 0, uVar31 = uVar31 - 1, bVar5) {
                pvVar20 = operator_new__((ulong)localSampleCount._data[lVar24 + lVar36] << 2);
                *(void **)(*(long *)((long)data._data + lVar26 + -8) * lVar34 * 8 +
                           *(long *)((long)&(data._data)->_sizeX + lVar26) + lVar36 * 8) = pvVar20;
                lVar26 = lVar26 + 0x18;
              }
            }
            lVar29 = lVar29 + lVar22;
            lVar28 = lVar28 + lVar25;
          }
          Imf_2_5::DeepScanLineInputFile::readPixels(&file,iVar30,iVar8);
        }
        else {
          std::operator<<((ostream *)&std::cout,"per-line ");
          std::ostream::flush();
          lVar25 = 0;
          for (lVar22 = 0; lVar22 <= (long)DAT_004233dc - (long)DAT_004233d4; lVar22 = lVar22 + 1) {
            iVar30 = DAT_004233d4 + (int)lVar22;
            Imf_2_5::DeepScanLineInputFile::readPixelSampleCounts(&file,iVar30);
            lVar28 = 0;
            while (lVar28 != 0x111) {
              lVar29 = lVar28 * 4;
              lVar34 = lVar28 * 4;
              lVar28 = lVar28 + 1;
              if (*(int *)((long)localSampleCount._data + lVar29 + localSampleCount._sizeY * lVar25)
                  != *(int *)((anonymous_namespace)::sampleCount._8_8_ * lVar25 +
                              (anonymous_namespace)::sampleCount._16_8_ + lVar34)) {
                __assert_fail("localSampleCount[i][j] == sampleCount[i][j]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                              ,0x199,
                              "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                             );
              }
            }
            for (lVar28 = 0; lVar28 != 0x111; lVar28 = lVar28 + 1) {
              lVar34 = localSampleCount._sizeY * lVar22;
              lVar29 = 4;
              for (uVar31 = 0; uVar18 != uVar31; uVar31 = uVar31 + 1) {
                if ((!randomChannels) ||
                   (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar31] == 1)) {
                  iVar8 = *(int *)((anonymous_namespace)::channelTypes + uVar31 * 4);
                  if (iVar8 == 0) {
                    pvVar20 = operator_new__((ulong)localSampleCount._data[lVar34 + lVar28] << 2);
                    *(void **)(*(long *)((long)data._data + lVar29 * 4 + -8) * lVar22 * 8 +
                               *(long *)((long)&(data._data)->_sizeX + lVar29 * 4) + lVar28 * 8) =
                         pvVar20;
                    iVar8 = *(int *)((anonymous_namespace)::channelTypes + uVar31 * 4);
                  }
                  if (iVar8 == 1) {
                    pvVar20 = operator_new__((ulong)localSampleCount._data[lVar34 + lVar28] * 2);
                    *(void **)(*(long *)((long)data._data + lVar29 * 4 + -8) * lVar22 * 8 +
                               *(long *)((long)&(data._data)->_sizeX + lVar29 * 4) + lVar28 * 8) =
                         pvVar20;
                    iVar8 = *(int *)((anonymous_namespace)::channelTypes + uVar31 * 4);
                  }
                  if (iVar8 == 2) {
                    pvVar20 = operator_new__((ulong)localSampleCount._data[lVar34 + lVar28] << 2);
                    *(void **)(*(long *)((long)data._data + lVar29 * 4 + -8) * lVar22 * 8 +
                               *(long *)((long)&(data._data)->_sizeX + lVar29 * 4) + lVar28 * 8) =
                         pvVar20;
                  }
                }
                lVar29 = lVar29 + 6;
              }
              lVar34 = localSampleCount._sizeY * lVar22;
              lVar29 = lVar35 * 0x18 + 0x10;
              uVar31 = uVar23;
              while (bVar5 = uVar31 != 0, uVar31 = uVar31 - 1, bVar5) {
                pvVar20 = operator_new__((ulong)localSampleCount._data[lVar34 + lVar28] << 2);
                *(void **)(*(long *)((long)data._data + lVar29 + -8) * lVar22 * 8 +
                           *(long *)((long)&(data._data)->_sizeX + lVar29) + lVar28 * 8) = pvVar20;
                lVar29 = lVar29 + 0x18;
              }
            }
            Imf_2_5::DeepScanLineInputFile::readPixels(&file,iVar30);
            lVar25 = lVar25 + 4;
          }
        }
        for (lVar25 = 0; lVar25 != 0xad; lVar25 = lVar25 + 1) {
          iVar30 = (int)lVar25;
          for (lVar22 = 0; lVar22 != 0x111; lVar22 = lVar22 + 1) {
            iVar8 = (int)lVar22;
            uVar7 = (uint)(iVar30 * 0x111 + iVar8) % 0x801;
            fVar37 = (float)uVar7;
            for (uVar31 = 0; uVar31 != uVar18; uVar31 = uVar31 + 1) {
              if ((!randomChannels) ||
                 (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar31] == 1)) {
                for (uVar32 = 0;
                    uVar32 < *(uint *)((anonymous_namespace)::sampleCount._8_8_ * lVar25 * 4 +
                                       (anonymous_namespace)::sampleCount._16_8_ + lVar22 * 4);
                    uVar32 = uVar32 + 1) {
                  iVar9 = *(int *)((anonymous_namespace)::channelTypes + uVar31 * 4);
                  if (iVar9 == 0) {
                    pvVar20 = data._data[uVar31]._data[data._data[uVar31]._sizeY * lVar25 + lVar22];
                    if (*(uint *)((long)pvVar20 + uVar32 * 4) != uVar7) {
                      poVar19 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
                      poVar19 = std::operator<<(poVar19,", ");
                      poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar30);
                      poVar19 = std::operator<<(poVar19," error, should be ");
                      poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar7);
                      poVar19 = std::operator<<(poVar19,", is ");
                      poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
                      std::endl<char,std::char_traits<char>>(poVar19);
                      std::ostream::flush();
                      if (*(uint *)((long)pvVar20 + uVar32 * 4) != uVar7) {
                        __assert_fail("value[l] == static_cast<unsigned int>(i * width + j) % 2049",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                                      ,0x1c3,
                                      "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                                     );
                      }
                    }
                    iVar9 = *(int *)((anonymous_namespace)::channelTypes + uVar31 * 4);
                  }
                  if (iVar9 == 1) {
                    ppvVar21 = data._data[uVar31]._data;
                    lVar28 = data._data[uVar31]._sizeY * lVar25;
                    pvVar20 = ppvVar21[lVar28 + lVar22];
                    fVar1 = *(float *)((long)&half::_toFloat +
                                      (ulong)*(ushort *)((long)pvVar20 + uVar32 * 2) * 4);
                    if ((fVar1 != fVar37) || (NAN(fVar1) || NAN(fVar37))) {
                      poVar19 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
                      poVar19 = std::operator<<(poVar19,", ");
                      poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar30);
                      poVar19 = std::operator<<(poVar19," error, should be ");
                      poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar7);
                      poVar19 = std::operator<<(poVar19,", is ");
                      poVar19 = (ostream *)
                                ::operator<<(poVar19,(half *)(ulong)*(ushort *)
                                                                     ((long)pvVar20 + uVar32 * 2));
                      std::endl<char,std::char_traits<char>>(poVar19);
                      std::ostream::flush();
                      ppvVar21 = data._data[uVar31]._data;
                      lVar28 = data._data[uVar31]._sizeY * lVar25;
                    }
                    fVar1 = *(float *)((long)&half::_toFloat +
                                      (ulong)*(ushort *)
                                              ((long)ppvVar21[lVar28 + lVar22] + uVar32 * 2) * 4);
                    if ((fVar1 != fVar37) || (NAN(fVar1) || NAN(fVar37))) {
                      __assert_fail("((half*)(data[k][i][j]))[l] == (i * width + j) % 2049",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                                    ,0x1cc,
                                    "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                                   );
                    }
                    iVar9 = *(int *)((anonymous_namespace)::channelTypes + uVar31 * 4);
                  }
                  if (iVar9 == 2) {
                    ppvVar21 = data._data[uVar31]._data;
                    lVar28 = data._data[uVar31]._sizeY * lVar25;
                    pvVar20 = ppvVar21[lVar28 + lVar22];
                    fVar1 = *(float *)((long)pvVar20 + uVar32 * 4);
                    if ((fVar1 != fVar37) || (NAN(fVar1) || NAN(fVar37))) {
                      poVar19 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
                      poVar19 = std::operator<<(poVar19,", ");
                      poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar30);
                      poVar19 = std::operator<<(poVar19," error, should be ");
                      poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar7);
                      poVar19 = std::operator<<(poVar19,", is ");
                      poVar19 = (ostream *)
                                std::ostream::operator<<
                                          (poVar19,*(float *)((long)pvVar20 + uVar32 * 4));
                      std::endl<char,std::char_traits<char>>(poVar19);
                      std::ostream::flush();
                      ppvVar21 = data._data[uVar31]._data;
                      lVar28 = data._data[uVar31]._sizeY * lVar25;
                    }
                    fVar1 = *(float *)((long)ppvVar21[lVar28 + lVar22] + uVar32 * 4);
                    if ((fVar1 != fVar37) || (NAN(fVar1) || NAN(fVar37))) {
                      __assert_fail("((float*)(data[k][i][j]))[l] == (i * width + j) % 2049",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineBasic.cpp"
                                    ,0x1d5,
                                    "void (anonymous namespace)::readFile(const std::string &, int, bool, bool)"
                                   );
                    }
                  }
                }
              }
            }
          }
        }
        for (lVar25 = 0; lVar25 != 0xad; lVar25 = lVar25 + 1) {
          for (lVar22 = 0; lVar22 != 0x111; lVar22 = lVar22 + 1) {
            lVar28 = 4;
            for (uVar31 = 0; lVar29 = lVar35 * 0x18 + 0x10, uVar32 = uVar23, uVar18 != uVar31;
                uVar31 = uVar31 + 1) {
              if ((!randomChannels) ||
                 (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar31] == 1)) {
                iVar30 = *(int *)((anonymous_namespace)::channelTypes + uVar31 * 4);
                if (iVar30 == 0) {
                  pvVar20 = *(void **)(*(long *)((long)data._data + lVar28 * 4 + -8) * lVar25 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar28 * 4) +
                                      lVar22 * 8);
                  if (pvVar20 == (void *)0x0) goto LAB_0013c716;
                  operator_delete__(pvVar20);
                  iVar30 = *(int *)((anonymous_namespace)::channelTypes + uVar31 * 4);
                }
                if (iVar30 == 1) {
                  pvVar20 = *(void **)(*(long *)((long)data._data + lVar28 * 4 + -8) * lVar25 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar28 * 4) +
                                      lVar22 * 8);
                  if (pvVar20 == (void *)0x0) goto LAB_0013c716;
                  operator_delete__(pvVar20);
                  iVar30 = *(int *)((anonymous_namespace)::channelTypes + uVar31 * 4);
                }
                if ((iVar30 == 2) &&
                   (pvVar20 = *(void **)(*(long *)((long)data._data + lVar28 * 4 + -8) * lVar25 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar28 * 4) +
                                        lVar22 * 8), pvVar20 != (void *)0x0)) {
                  operator_delete__(pvVar20);
                }
              }
LAB_0013c716:
              lVar28 = lVar28 + 6;
            }
            while (uVar32 != 0) {
              pvVar20 = *(void **)(*(long *)((long)data._data + lVar29 + -8) * lVar25 * 8 +
                                   *(long *)((long)&(data._data)->_sizeX + lVar29) + lVar22 * 8);
              if (pvVar20 != (void *)0x0) {
                operator_delete__(pvVar20);
              }
              lVar29 = lVar29 + 0x18;
              uVar32 = uVar32 - 1;
            }
          }
        }
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&read_channel.super__Vector_base<int,_std::allocator<int>_>);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
                   *)&frameBuffer);
      Imf_2_5::Array<Imf_2_5::Array2D<void_*>_>::~Array(&data);
      Imf_2_5::Array2D<unsigned_int>::~Array2D(&localSampleCount);
      Imf_2_5::DeepScanLineInputFile::~DeepScanLineInputFile(&file);
      return;
    }
    if (randomChannels) {
      iVar8 = random_int(2);
      read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar23] = iVar8;
      if (iVar8 == 1) goto LAB_0013bbdf;
    }
    else {
LAB_0013bbdf:
      PVar4 = *(PixelType *)((anonymous_namespace)::channelTypes + uVar23 * 4);
      t = (uint)(PVar4 != UINT) * 3;
      if (PVar4 == HALF) {
        t = PVar4;
      }
      if (PVar4 == FLOAT) {
        t = PVar4;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1a8,(int)uVar23);
      std::__cxx11::stringbuf::str();
      iVar8 = *(int *)((anonymous_namespace)::channelTypes + uVar23 * 4);
      spst = (ulong)(iVar8 == 0) << 2;
      if (iVar8 == 1) {
        spst = 2;
      }
      if (iVar8 == 2) {
        spst = 4;
      }
      Imf_2_5::DeepSlice::DeepSlice
                (&local_1f0,t,
                 (char *)(*(long *)((long)&(data._data)->_sizeX + lVar35) +
                          (long)(anonymous_namespace)::dataWindow * -8 + (long)DAT_004233d4 * -0x888
                         ),8,0x888,spst,1,1,0.0,false,false);
      Imf_2_5::DeepFrameBuffer::insert(&frameBuffer,&str,&local_1f0);
      iVar30 = iVar30 + 1;
      std::__cxx11::string::~string((string *)&str);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    }
    uVar23 = uVar23 + 1;
    lVar35 = lVar35 + 0x18;
  } while( true );
}

Assistant:

void readFile (const std::string & filename,
               int channelCount,
               bool bulkRead,
               bool randomChannels)
{
    if(randomChannels)
    {
      cout << " reading random channels " << flush;
    }
    else
    {
      cout << " reading all channels " << flush;
    }
    
    DeepScanLineInputFile file(filename.c_str(), 8);

    const Header& fileHeader = file.header();
    assert (fileHeader.displayWindow() == header.displayWindow());
    assert (fileHeader.dataWindow() == header.dataWindow());
    assert (fileHeader.pixelAspectRatio() == header.pixelAspectRatio());
    assert (fileHeader.screenWindowCenter() == header.screenWindowCenter());
    assert (fileHeader.screenWindowWidth() == header.screenWindowWidth());
    assert (fileHeader.lineOrder() == header.lineOrder());
    assert (fileHeader.compression() == header.compression());
    assert (fileHeader.channels() == header.channels());
    assert (fileHeader.type() == header.type());

    Array2D<unsigned int> localSampleCount;
    localSampleCount.resizeErase(height, width);
    
        
    // also test filling channels. Generate up to 2 extra channels
    int fillChannels=random_int(3);
    
    Array<Array2D< void* > > data(channelCount+fillChannels);
    for (int i = 0; i < channelCount+fillChannels; i++)
        data[i].resizeErase(height, width);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (IMF::UINT,                    // type // 7
                                        (char *) (&localSampleCount[0][0]
                                                  - dataWindow.min.x
                                                  - dataWindow.min.y * width),               // base // 8)
                                        sizeof (unsigned int) * 1,          // xStride// 9
                                        sizeof (unsigned int) * width));    // yStride// 10

    vector<int> read_channel(channelCount);
    
    
    int channels_added=0;
    
    for (int i = 0; i < channelCount; i++)
    {
        if(randomChannels)
        {
	     read_channel[i] = random_int(2);
	     
        }
        if(!randomChannels || read_channel[i]==1)
	{
            PixelType type = NUM_PIXELTYPES;
            if (channelTypes[i] == 0)
                type = IMF::UINT;
            if (channelTypes[i] == 1)
                type = IMF::HALF;
            if (channelTypes[i] == 2)
                type = IMF::FLOAT;

            stringstream ss;
            ss << i;
            string str = ss.str();

            int sampleSize = 0;
            if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
            if (channelTypes[i] == 1) sampleSize = sizeof (half);
            if (channelTypes[i] == 2) sampleSize = sizeof (float);

            int pointerSize = sizeof (char *);

            frameBuffer.insert (str,                            // name // 6
                                DeepSlice (type,                    // type // 7
                                (char *) (&data[i][0][0]
                                          - dataWindow.min.x
                                          - dataWindow.min.y * width),               // base // 8)
                                pointerSize * 1,          // xStride// 9
                                pointerSize * width,      // yStride// 10
                                sampleSize));             // sampleStride
	    channels_added++;
        }
    }
    
    
    if(channels_added==0)
    {
      cout << "skipping " <<flush;
      return;
    }
    for(int i = 0 ; i < fillChannels ; ++i )
    { 
            PixelType type  = IMF::FLOAT;
            int sampleSize = sizeof(float);            
            int pointerSize = sizeof (char *);
            stringstream ss;
            // generate channel names that aren't in file but (might) interleave with existing file
            ss << i << "fill";
            string str = ss.str();
               frameBuffer.insert (str,                            // name // 6
                                DeepSlice (type,                    // type // 7
                                (char *) (&data[i+channelCount][0][0]
                                          - dataWindow.min.x
                                          - dataWindow.min.y * width),               // base // 8)
                                pointerSize * 1,          // xStride// 9
                                pointerSize * width,      // yStride// 10
                                sampleSize));             // sampleStride
    }
    file.setFrameBuffer(frameBuffer);

    if (bulkRead)
    {
        cout << "bulk " << flush;
        file.readPixelSampleCounts(dataWindow.min.y, dataWindow.max.y);
        for (int i = 0; i < dataWindow.max.y - dataWindow.min.y + 1; i++)
        {
            for (int j = 0; j < width; j++)
                assert(localSampleCount[i][j] == sampleCount[i][j]);

            for (int j = 0; j < width; j++)
            {
                for (int k = 0; k < channelCount; k++)
                {
                    if(!randomChannels || read_channel[k]==1)
                    {
                                if (channelTypes[k] == 0)
                                    data[k][i][j] = new unsigned int[localSampleCount[i][j]];
                                if (channelTypes[k] == 1)
                                    data[k][i][j] = new half[localSampleCount[i][j]];
                                if (channelTypes[k] == 2)
                                    data[k][i][j] = new float[localSampleCount[i][j]];
                    }
                }
                for( int f = 0 ; f < fillChannels ; ++f )
                {
                       data[f+channelCount][i][j] = new float[localSampleCount[i][j]];
                }
            }
        }
        
        file.readPixels(dataWindow.min.y, dataWindow.max.y);
    }
    
    else
    {
        cout << "per-line " << flush;
        for (int i = 0; i < dataWindow.max.y - dataWindow.min.y + 1; i++)
        {
            int y = i + dataWindow.min.y;
            file.readPixelSampleCounts(y);

            for (int j = 0; j < width; j++)
                assert(localSampleCount[i][j] == sampleCount[i][j]);

            for (int j = 0; j < width; j++)
            {
                for (int k = 0; k < channelCount; k++)
                {
                    if( !randomChannels || read_channel[k]==1)
                    {
                                if (channelTypes[k] == 0)
                                    data[k][i][j] = new unsigned int[localSampleCount[i][j]];
                                if (channelTypes[k] == 1)
                                    data[k][i][j] = new half[localSampleCount[i][j]];
                                if (channelTypes[k] == 2)
                                    data[k][i][j] = new float[localSampleCount[i][j]];
                    }
                }
                for( int f = 0 ; f < fillChannels ; ++f )
                {
                       data[f+channelCount][i][j] = new float[localSampleCount[i][j]];
                }
            }

            file.readPixels(y);
	    
        }
    }

    for (int i = 0; i < height; i++)
        for (int j = 0; j < width; j++)
            for (int k = 0; k < channelCount; k++)
            {
                if( !randomChannels || read_channel[k]==1 )
                {
                    for (unsigned int l = 0; l < sampleCount[i][j]; l++)
                    {
                        if (channelTypes[k] == 0)
                        {
                            unsigned int* value = (unsigned int*)(data[k][i][j]);
                            if (value[l] != static_cast<unsigned int>(i * width + j) % 2049)
                                cout << j << ", " << i << " error, should be "
                                     << (i * width + j) % 2049 << ", is " << value[l]
                                     << endl << flush;
                            assert (value[l] == static_cast<unsigned int>(i * width + j) % 2049);
                        }
                        if (channelTypes[k] == 1)
                        {
                            half* value = (half*)(data[k][i][j]);
                            if (value[l] != (i * width + j) % 2049)
                                cout << j << ", " << i << " error, should be "
                                     << (i * width + j) % 2049 << ", is " << value[l]
                                     << endl << flush;
                            assert (((half*)(data[k][i][j]))[l] == (i * width + j) % 2049);
                        }
                        if (channelTypes[k] == 2)
                        {
                            float* value = (float*)(data[k][i][j]);
                            if (value[l] != (i * width + j) % 2049)
                                cout << j << ", " << i << " error, should be "
                                     << (i * width + j) % 2049 << ", is " << value[l]
                                     << endl << flush;
                            assert (((float*)(data[k][i][j]))[l] == (i * width + j) % 2049);
                        }
                    }
                }
            }

    for (int i = 0; i < height; i++)
        for (int j = 0; j < width; j++)
        {
            for (int k = 0; k < channelCount; k++)
            {
                if( !randomChannels || read_channel[k]==1 )
                {
                    if (channelTypes[k] == 0)
                        delete[] (unsigned int*) data[k][i][j];
                    if (channelTypes[k] == 1)
                        delete[] (half*) data[k][i][j];
                    if (channelTypes[k] == 2)
                        delete[] (float*) data[k][i][j];
                }
            }
            for( int f = 0 ; f < fillChannels ; ++f )
            {
                 delete[] (float*) data[f+channelCount][i][j];
            }
       }
}